

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O2

void __thiscall OmegaSN::backtracking(OmegaSN *this,uint n)

{
  uint **ppuVar1;
  double **ppdVar2;
  undefined8 in_RAX;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  undefined8 local_38;
  
  uVar4 = (ulong)n;
  uVar6 = (ulong)(this->nbSegments - 1);
  ppdVar2 = this->Q[uVar6];
  dVar7 = (*ppdVar2)[n];
  uVar3 = 0;
  for (uVar5 = 1; uVar5 < this->nbStates; uVar5 = uVar5 + 1) {
    if (ppdVar2[uVar5][n] < dVar7) {
      uVar3 = uVar5 & 0xffffffff;
      dVar7 = ppdVar2[uVar5][n];
    }
  }
  this->globalCost = ppdVar2[uVar3][n];
  local_38 = in_RAX;
  for (; 1 < (uint)uVar4; uVar4 = (ulong)(*ppuVar1)[uVar4]) {
    local_38 = CONCAT44(local_38._4_4_,(uint)uVar4);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->changepoints,(int *)&local_38);
    std::vector<double,_std::allocator<double>_>::push_back(&this->parameters,this->states + uVar3);
    ppuVar1 = this->lastChpt[uVar6] + uVar3;
    uVar3 = (ulong)this->lastIndState[uVar6][uVar3]
                   [(this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1]];
    uVar6 = (ulong)((int)uVar6 - 1);
  }
  local_38 = CONCAT44(1,(int)local_38);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&this->changepoints,(int *)((long)&local_38 + 4));
  std::vector<double,_std::allocator<double>_>::push_back(&this->parameters,this->states + uVar3);
  std::__reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::__reverse<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void OmegaSN::backtracking(unsigned int n)
{
  unsigned int p = nbStates;
  double temp_Q = Q[nbSegments - 1][0][n];
  unsigned int temp_indState = 0;

  for(unsigned int v = 1; v < p; v++)
  {
    if(Q[nbSegments - 1][v][n] < temp_Q)
    {
      temp_Q = Q[nbSegments - 1][v][n];
      temp_indState = v;
    }
  }

  globalCost = Q[nbSegments - 1][temp_indState][n]; ///fill the globalCost OmegaSN variable
  unsigned int temp_chpt = n;
  unsigned int nb = nbSegments - 1;

// /*
//std::cout << " u " << temp_indState << " t " << temp_chpt << std::endl;

  while(temp_chpt > 1)
  {
    changepoints.push_back(temp_chpt);
    parameters.push_back(states[temp_indState]);

    temp_chpt = lastChpt[nb][temp_indState][temp_chpt];
    temp_indState = lastIndState[nb][temp_indState][changepoints[changepoints.size()-1]];
    nb = nb - 1;
    //std::cout << " u " << temp_indState << " t " << temp_chpt << std::endl;
  }

  changepoints.push_back(1);
  parameters.push_back(states[temp_indState]);

  // */

  ///reverse the vector
  std::reverse(changepoints.begin(), changepoints.end());
  std::reverse(parameters.begin(), parameters.end());
}